

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void xc_lda_sanity_check(xc_func_info_type *info,int order,xc_lda_out_params *out)

{
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  if (((int)in_ESI < 0) || (4 < (int)in_ESI)) {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)in_ESI);
    exit(1);
  }
  if ((*in_RDX != 0) && ((*(uint *)(in_RDI + 0x40) & 1) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of Exc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  if ((in_RDX[1] != 0) && ((*(uint *)(in_RDI + 0x40) & 2) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of vxc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  if ((in_RDX[2] != 0) && ((*(uint *)(in_RDI + 0x40) & 4) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of fxc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  if ((in_RDX[3] != 0) && ((*(uint *)(in_RDI + 0x40) & 8) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of kxc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  return;
}

Assistant:

void
xc_lda_sanity_check(const xc_func_info_type *info, int order, xc_lda_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }

  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL && !(info->flags & XC_FLAGS_HAVE_VXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
	    info->name);
    exit(1);
  }

  if(out->v2rho2 != NULL && !(info->flags & XC_FLAGS_HAVE_FXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
	    info->name);
    exit(1);
  }

  if(out->v3rho3 != NULL && !(info->flags & XC_FLAGS_HAVE_KXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
	    info->name);
    exit(1);
  }
}